

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void min_w_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  Fl_Type *pFVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  Fl_Type **ppFVar6;
  
  if ((char *)v == "LOAD") {
    iVar5 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    pp_Var3 = (((i->super_Fl_Valuator).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget;
    if (iVar5 != 0) {
      (*pp_Var3[5])();
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)current_widget[1].super_Fl_Type.level);
      return;
    }
    (*pp_Var3[6])();
    return;
  }
  dVar1 = (i->super_Fl_Valuator).value_;
  bVar4 = false;
  ppFVar6 = &Fl_Type::first;
  while (pFVar2 = *ppFVar6, pFVar2 != (Fl_Type *)0x0) {
    if (pFVar2->selected != '\0') {
      iVar5 = (*pFVar2->_vptr_Fl_Type[0x21])(pFVar2);
      if (iVar5 != 0) {
        current_widget[1].super_Fl_Type.level = (int)dVar1;
        bVar4 = true;
      }
    }
    ppFVar6 = &pFVar2->next;
  }
  if (bVar4) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void min_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->parent()->hide(); return;}
    i->parent()->show();
    i->value(((Fl_Window_Type*)current_widget)->sr_min_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_min_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}